

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_batchcompute_list_snapshots.cc
# Opt level: O3

int __thiscall
aliyun::BatchCompute::ListSnapshots
          (BatchCompute *this,BatchComputeListSnapshotsResponseType *response,
          BatchComputeErrorInfo *error_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  AliRoaRequest *this_00;
  size_t sVar6;
  Value *pVVar7;
  ulong *puVar8;
  char *pcVar9;
  undefined8 uVar10;
  Value val;
  string url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string secheme;
  string str_response;
  Reader reader;
  string local_2d8;
  Value local_2b8;
  long *local_2a0;
  long local_298;
  long local_290;
  undefined8 uStack_288;
  string local_280;
  long *local_260 [2];
  long local_250 [2];
  long *local_240;
  long local_238;
  long local_230 [2];
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_220._M_string_length = 0;
  local_220.field_2._M_local_buf[0] = '\0';
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  Json::Value::Value(&local_2b8,nullValue);
  Json::Reader::Reader(&local_140);
  pcVar9 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar9 = "https";
  }
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,pcVar9,pcVar9 + (ulong)this->use_tls_ + 4);
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_260,local_240,local_238 + (long)local_240);
  std::__cxx11::string::append((char *)local_260);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_260);
  paVar1 = &local_2d8.field_2;
  puVar8 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_2d8.field_2._M_allocated_capacity = *puVar8;
    local_2d8.field_2._8_4_ = (undefined4)plVar4[3];
    local_2d8.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_2d8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *puVar8;
    local_2d8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_2d8._M_string_length = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  get_format_string_abi_cxx11_(&local_280,"/snapshots");
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    uVar10 = local_2d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_280._M_string_length + local_2d8._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      uVar10 = local_280.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_280._M_string_length + local_2d8._M_string_length) goto LAB_00128347;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_280,0,(char *)0x0,(ulong)local_2d8._M_dataplus._M_p);
  }
  else {
LAB_00128347:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_280._M_dataplus._M_p);
  }
  local_2a0 = &local_290;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_290 = *plVar4;
    uStack_288 = puVar5[3];
  }
  else {
    local_290 = *plVar4;
    local_2a0 = (long *)*puVar5;
  }
  local_298 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_260[0] != local_250) {
    operator_delete(local_260[0],local_250[0] + 1);
  }
  this_00 = (AliRoaRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_280);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_2a0,(undefined1 *)(local_298 + (long)local_2a0));
  AliRoaRequest::AliRoaRequest(this_00,&local_160,&local_180,&local_1a0,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar9 = this->proxy_host_, pcVar9 != (char *)0x0)) &&
     (*pcVar9 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar6 = strlen(pcVar9);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar9,pcVar9 + sVar6);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"GET","");
  AliHttpRequest::setRequestMethod((AliHttpRequest *)this_00,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  iVar3 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar3 == 0) {
    iVar3 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_220);
    if ((0 < iVar3) && (local_220._M_string_length != 0)) {
      bVar2 = Json::Reader::parse(&local_140,&local_220,&local_2b8,true);
      if (bVar2) {
        if (error_info != (BatchComputeErrorInfo *)0x0 && iVar3 != 200) {
          bVar2 = Json::Value::isMember(&local_2b8,"RequestId");
          if (bVar2) {
            pVVar7 = Json::Value::operator[](&local_2b8,"RequestId");
            Json::Value::asString_abi_cxx11_(&local_2d8,pVVar7);
          }
          else {
            local_2d8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2d8,anon_var_dwarf_100519 + 9);
          }
          std::__cxx11::string::operator=((string *)error_info,(string *)&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          bVar2 = Json::Value::isMember(&local_2b8,"Code");
          if (bVar2) {
            pVVar7 = Json::Value::operator[](&local_2b8,"Code");
            Json::Value::asString_abi_cxx11_(&local_2d8,pVVar7);
          }
          else {
            local_2d8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2d8,anon_var_dwarf_100519 + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          bVar2 = Json::Value::isMember(&local_2b8,"HostId");
          if (bVar2) {
            pVVar7 = Json::Value::operator[](&local_2b8,"HostId");
            Json::Value::asString_abi_cxx11_(&local_2d8,pVVar7);
          }
          else {
            local_2d8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2d8,anon_var_dwarf_100519 + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          bVar2 = Json::Value::isMember(&local_2b8,"Message");
          if (bVar2) {
            pVVar7 = Json::Value::operator[](&local_2b8,"Message");
            Json::Value::asString_abi_cxx11_(&local_2d8,pVVar7);
          }
          else {
            local_2d8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2d8,anon_var_dwarf_100519 + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_001286ba;
      }
    }
    if (error_info == (BatchComputeErrorInfo *)0x0) goto LAB_001286b5;
    pcVar9 = "parse response failed";
  }
  else {
    if (error_info == (BatchComputeErrorInfo *)0x0) {
LAB_001286b5:
      iVar3 = -1;
      goto LAB_001286ba;
    }
    pcVar9 = "connect to host failed";
  }
  iVar3 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar9);
LAB_001286ba:
  AliRoaRequest::~AliRoaRequest(this_00);
  operator_delete(this_00,0x2c8);
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0,local_290 + 1);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,
                    CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                             local_220.field_2._M_local_buf[0]) + 1);
  }
  return iVar3;
}

Assistant:

int BatchCompute::ListSnapshots(BatchComputeListSnapshotsResponseType* response,
                      BatchComputeErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  Json::Value val;
  Json::Reader reader;
  std::string secheme = this->use_tls_ ? "https" : "http";
  std::string url = secheme  + "://" + host_ + get_format_string("/snapshots");
  AliRoaRequest* req_rpc = new AliRoaRequest(version_,
                         appid_,
                         secret_,
                         url);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  req_rpc->setRequestMethod("GET");
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}